

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

void __thiscall
cfd::core::Serializer::AddVariableBuffer(Serializer *this,uint8_t *buffer,uint32_t buffer_size)

{
  AddVariableInt(this,(ulong)buffer_size);
  if (buffer_size != 0 && buffer != (uint8_t *)0x0) {
    CheckNeedSize(this,buffer_size);
    memcpy((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start + this->offset_,buffer,(ulong)buffer_size);
    this->offset_ = this->offset_ + buffer_size;
  }
  return;
}

Assistant:

void Serializer::AddVariableBuffer(
    const uint8_t* buffer, uint32_t buffer_size) {
  AddVariableInt(buffer_size);
  AddDirectBytes(buffer, buffer_size);
}